

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void processImage(Mat *inputImg,char imageId)

{
  __tuple_element_t<0UL,_tuple<bool,_float,_Mat>_> *p_Var1;
  ostream *poVar2;
  __tuple_element_t<1UL,_tuple<bool,_float,_Mat>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<bool,_float,_Mat>_> *p_Var4;
  vector<int,_std::allocator<int>_> local_218;
  _InputArray local_200;
  allocator local_1e1;
  string local_1e0 [8];
  string fileName;
  undefined1 local_1c0 [8];
  tuple<bool,_float,_cv::Mat> output3;
  tuple<bool,_float,_cv::Mat> output2;
  Mat newImg;
  undefined1 local_80 [8];
  tuple<bool,_float,_cv::Mat> output;
  char imageId_local;
  Mat *inputImg_local;
  
  output.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>._103_1_
       = imageId;
  removeNoiseIfPresent((tuple<bool,_float,_cv::Mat> *)local_80,inputImg);
  p_Var1 = std::get<0ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_80);
  if ((*p_Var1 & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No noise!");
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"Noise %: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_80);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Noisy: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_80);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  p_Var4 = std::get<2ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_80);
  cv::Mat::Mat((Mat *)&output2.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                       super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>,
               p_Var4);
  removeBlurIfPresent((tuple<bool,_float,_cv::Mat> *)
                      &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                       super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>,
                      (Mat *)&output2.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                              super__Tuple_impl<1UL,_float,_cv::Mat>.
                              super__Head_base<1UL,_float,_false>);
  p_Var1 = std::get<0ul,bool,float,cv::Mat>
                     ((tuple<bool,_float,_cv::Mat> *)
                      &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                       super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>);
  if ((*p_Var1 & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No Blur! ");
    poVar2 = std::operator<<(poVar2,"Blur %: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>
                       ((tuple<bool,_float,_cv::Mat> *)
                        &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                         super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Blurry: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>
                       ((tuple<bool,_float,_cv::Mat> *)
                        &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                         super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  p_Var4 = std::get<2ul,bool,float,cv::Mat>
                     ((tuple<bool,_float,_cv::Mat> *)
                      &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                       super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>);
  cv::Mat::operator=((Mat *)&output2.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                             super__Tuple_impl<1UL,_float,_cv::Mat>.
                             super__Head_base<1UL,_float,_false>,p_Var4);
  removeCollapsnessIfPresent
            ((tuple<bool,_float,_cv::Mat> *)local_1c0,
             (Mat *)&output2.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                     super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>);
  p_Var1 = std::get<0ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_1c0);
  if ((*p_Var1 & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No Collapsness! ");
    poVar2 = std::operator<<(poVar2,"Collapsness %: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Collapsed: ");
    p_Var3 = std::get<1ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*p_Var3);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"fixed",&local_1e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::operator+=
            (local_1e0,
             output.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
             super__Tuple_impl<1UL,_float,_cv::Mat>._103_1_);
  std::__cxx11::string::operator+=(local_1e0,".jpg");
  p_Var4 = std::get<2ul,bool,float,cv::Mat>((tuple<bool,_float,_cv::Mat> *)local_1c0);
  cv::_InputArray::_InputArray(&local_200,p_Var4);
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_218);
  cv::imwrite(local_1e0,&local_200,(vector *)&local_218);
  std::vector<int,_std::allocator<int>_>::~vector(&local_218);
  cv::_InputArray::~_InputArray(&local_200);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e0);
  std::tuple<bool,_float,_cv::Mat>::~tuple((tuple<bool,_float,_cv::Mat> *)local_1c0);
  std::tuple<bool,_float,_cv::Mat>::~tuple
            ((tuple<bool,_float,_cv::Mat> *)
             &output3.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
              super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>);
  cv::Mat::~Mat((Mat *)&output2.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                        super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>);
  std::tuple<bool,_float,_cv::Mat>::~tuple((tuple<bool,_float,_cv::Mat> *)local_80);
  return;
}

Assistant:

void processImage(Mat const& inputImg, char imageId) {
    tuple<bool,float,Mat> output = removeNoiseIfPresent(inputImg);
    if (get<0>(output)) {
        cout << "Noisy: " << get<1>(output)<<"%"<<endl;
    } else {
        cout<<"No noise!"<< " " << "Noise %: " <<get<1>(output)<<"%"<<endl;
    }

    Mat newImg = get<2>(output);
    tuple<bool,float,Mat> output2= removeBlurIfPresent(newImg);
    if (get<0>(output2)) {
        cout << "Blurry: " << get<1>(output2)<<"%"<<endl;
    } else {
        cout<<"No Blur! "<<"Blur %: "<< get<1>(output2)<<"%"<<endl;
    }

    newImg = get<2>(output2);
    tuple<bool,float,Mat> output3= removeCollapsnessIfPresent(newImg);
    if (get<0>(output3)) {
        cout << "Collapsed: " << get<1>(output3)<<"%"<<endl;
    } else {
        cout<<"No Collapsness! "<<"Collapsness %: "<< get<1>(output3)<<"%"<<endl;
    }
    string fileName = "fixed";
    fileName += imageId;
    fileName += ".jpg";

    imwrite(fileName, get<2>(output3));
    cout << "-----------------------------------------------------------------------------" <<endl;
}